

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTest::GraphTest(GraphTest *this)

{
  State *pSVar1;
  VirtualFileSystem *this_00;
  
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001c0ed0;
  this_00 = &this->fs_;
  VirtualFileSystem::VirtualFileSystem(this_00);
  (this->scan_).build_log_ = (BuildLog *)0x0;
  pSVar1 = &(this->super_StateTestWithBuiltinRules).state_;
  (this->scan_).disk_interface_ = &this_00->super_DiskInterface;
  (this->scan_).dep_loader_.state_ = pSVar1;
  (this->scan_).dep_loader_.disk_interface_ = &this_00->super_DiskInterface;
  (this->scan_).dep_loader_.deps_log_ = (DepsLog *)0x0;
  (this->scan_).dep_loader_.depfile_parser_options_ = (DepfileParserOptions *)0x0;
  (this->scan_).dyndep_loader_.state_ = pSVar1;
  (this->scan_).dyndep_loader_.disk_interface_ = &this_00->super_DiskInterface;
  return;
}

Assistant:

GraphTest() : scan_(&state_, NULL, NULL, &fs_, NULL) {}